

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall
QXmlStreamAttributes::append(QXmlStreamAttributes *this,QString *qualifiedName,QString *value)

{
  long in_FS_OFFSET;
  QXmlStreamAttribute local_80;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamAttribute::QXmlStreamAttribute(&local_80,qualifiedName,value);
  QList<QXmlStreamAttribute>::emplaceBack<QXmlStreamAttribute>
            (&this->super_QList<QXmlStreamAttribute>,&local_80);
  QXmlStreamAttribute::~QXmlStreamAttribute(&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamAttributes::append(const QString &qualifiedName, const QString &value)
{
    append(QXmlStreamAttribute(qualifiedName, value));
}